

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Approx::setEpsilon(Approx *this,double newEpsilon)

{
  ReusableStringStream *pRVar1;
  char local_55 [13];
  ReusableStringStream local_48;
  string local_38;
  double local_18;
  double newEpsilon_local;
  Approx *this_local;
  
  if ((0.0 <= newEpsilon) && (newEpsilon <= 1.0)) {
    this->m_epsilon = newEpsilon;
    return;
  }
  local_18 = newEpsilon;
  newEpsilon_local = (double)this;
  ReusableStringStream::ReusableStringStream(&local_48);
  pRVar1 = ReusableStringStream::operator<<(&local_48,(char (*) [26])"Invalid Approx::epsilon: ");
  pRVar1 = ReusableStringStream::operator<<(pRVar1,&local_18);
  local_55[0] = '.';
  pRVar1 = ReusableStringStream::operator<<(pRVar1,local_55);
  pRVar1 = ReusableStringStream::operator<<
                     (pRVar1,(char (*) [37])" Approx::epsilon has to be in [0, 1]");
  ReusableStringStream::str_abi_cxx11_(&local_38,pRVar1);
  throw_domain_error(&local_38);
}

Assistant:

void Approx::setEpsilon(double newEpsilon) {
        CATCH_ENFORCE(newEpsilon >= 0 && newEpsilon <= 1.0,
            "Invalid Approx::epsilon: " << newEpsilon << '.'
            << " Approx::epsilon has to be in [0, 1]");
        m_epsilon = newEpsilon;
    }